

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  undefined1 uVar4;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pvVar5;
  istream *piVar6;
  ostream *poVar7;
  int iVar8;
  pointer pbVar9;
  string line;
  ifstream input_file;
  char local_266;
  char local_265;
  int local_264;
  char *local_260;
  long local_258;
  char local_250;
  undefined7 uStack_24f;
  pointer local_240;
  long local_238 [65];
  
  program_options::parse(argc,argv);
  pvVar5 = program_options::input_files();
  pbVar9 = (pvVar5->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_240 = (pvVar5->
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 != local_240) {
    local_264 = 0;
    do {
      std::ifstream::ifstream((istream *)local_238,pbVar9->_M_str,_S_in);
      local_265 = std::__basic_file<char>::is_open();
      if (local_265 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"dog: could not open input file \'",0x20);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,pbVar9->_M_str,pbVar9->_M_len);
        local_264 = 1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'!\n",3);
      }
      else {
        local_260 = &local_250;
        local_258 = 0;
        local_250 = '\0';
        iVar8 = 1;
        while( true ) {
          cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                  (char)(istream *)local_238);
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_238,(string *)&local_260,cVar2);
          if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
          bVar3 = program_options::show_line_numbers();
          lVar1 = std::cout;
          if (bVar3) {
            *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 6;
            lVar1 = *(long *)(lVar1 + -0x18);
            if (*(char *)(lVar1 + 0x1071b1) == '\0') {
              uVar4 = std::ios::widen((char)lVar1 + -0x30);
              *(undefined1 *)(lVar1 + 0x1071b0) = uVar4;
              *(undefined1 *)(lVar1 + 0x1071b1) = 1;
            }
            *(undefined1 *)(lVar1 + 0x1071b0) = 0x20;
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
            iVar8 = iVar8 + 1;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,local_260,local_258);
          bVar3 = program_options::show_ends();
          if (bVar3) {
            local_266 = '$';
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_266,1);
          }
          local_266 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_266,1);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
        }
      }
      std::ifstream::~ifstream((istream *)local_238);
      if (local_265 == '\0') {
        return local_264;
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != local_240);
  }
  return 0;
}

Assistant:

int
main(int argc, char *argv[]) {
    try {
        program_options::parse(argc, argv);
    } catch (const std::exception &x) {
        std::cerr << x.what() << '\n';
        std::cerr << "usage: dog [-n|--number] [-E|--show-ends] <input_file> ...\n";
        return EXIT_FAILURE;
    }

    for (const auto &file_name : program_options::input_files()) {
        std::ifstream input_file(file_name.data(), std::ios::in);
        if (!input_file.is_open()) {
            std::cerr << "dog: could not open input file '" << file_name << "'!\n";
            return EXIT_FAILURE;
        }

        std::string line;
        int         line_count = 1;
        while (std::getline(input_file, line)) {
            if (program_options::show_line_numbers()) {
                std::cout << std::setw(6) << std::setfill(' ') << line_count++ << "  ";
            }

            std::cout << line;

            if (program_options::show_ends()) {
                std::cout << '$';
            }

            std::cout << '\n';
        }
    }

    return EXIT_SUCCESS;
}